

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O1

void ipc_on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  undefined8 uVar2;
  uv_pipe_t *puVar3;
  void *pvVar4;
  undefined8 *extraout_RDX;
  uv_pipe_t *unaff_RBX;
  int iVar5;
  undefined8 *__size;
  uv_tcp_t *puVar6;
  long *plVar7;
  int64_t eval_b;
  int64_t eval_a;
  int64_t eval_b_3;
  undefined8 uStack_100;
  code *pcStack_f8;
  long lStack_f0;
  long lStack_e8;
  undefined1 auStack_e0 [16];
  uv_pipe_t *puStack_d0;
  long lStack_c8;
  long lStack_c0;
  undefined1 auStack_b8 [16];
  undefined1 auStack_a8 [16];
  uv_pipe_t *puStack_98;
  undefined8 uStack_88;
  code *pcStack_80;
  long alStack_78 [2];
  undefined1 auStack_68 [16];
  uv_pipe_t *puStack_58;
  undefined1 auStack_50 [16];
  uv_loop_t *apuStack_40 [2];
  undefined1 local_18 [16];
  uv_alloc_cb local_8;
  
  if (connection_accepted != '\0') {
    return;
  }
  local_18._0_8_ = SEXT48(status);
  if (local_18._0_8_ == 0) {
    if (server != (uv_stream_t *)&tcp_server) goto LAB_001aa39f;
    iVar1 = uv_tcp_init(tcp_server.loop,0x36cc70);
    local_18._0_8_ = SEXT48(iVar1);
    if (local_18._0_8_ != 0) goto LAB_001aa3a4;
    iVar1 = uv_accept(&tcp_server,0x36cc70);
    local_18._0_8_ = SEXT48(iVar1);
    if (local_18._0_8_ != 0) goto LAB_001aa3b3;
    uv_close(0x36cc70,close_cb);
    local_18 = uv_buf_init("accepted_connection\n",0x14);
    iVar1 = uv_write2(&conn_notify_req,&channel,local_18,1,0,conn_notify_write_cb);
    local_8 = (uv_alloc_cb)0x0;
    if (iVar1 == 0) {
      connection_accepted = 1;
      return;
    }
  }
  else {
    ipc_on_connection_cold_1();
LAB_001aa39f:
    ipc_on_connection_cold_2();
LAB_001aa3a4:
    ipc_on_connection_cold_3();
LAB_001aa3b3:
    ipc_on_connection_cold_4();
  }
  ipc_on_connection_cold_5();
  puVar6 = (uv_tcp_t *)auStack_50;
  puStack_58 = (uv_pipe_t *)0x1aa3db;
  uVar2 = uv_default_loop();
  puStack_58 = (uv_pipe_t *)0x1aa3ef;
  iVar1 = uv_pipe_init(uVar2,&channel,1);
  apuStack_40[0] = (uv_loop_t *)(long)iVar1;
  auStack_50._0_8_ = (uv_loop_t *)0x0;
  if (apuStack_40[0] == (uv_loop_t *)0x0) {
    unaff_RBX = &channel;
    puStack_58 = (uv_pipe_t *)0x1aa41e;
    uv_pipe_open(&channel,0);
    apuStack_40[0] = (uv_loop_t *)0x1;
    puStack_58 = (uv_pipe_t *)0x1aa42f;
    iVar1 = uv_is_readable(&channel);
    auStack_50._0_8_ = SEXT48(iVar1);
    if (apuStack_40[0] != (uv_loop_t *)auStack_50._0_8_) goto LAB_001aa706;
    apuStack_40[0] = (uv_loop_t *)0x1;
    puStack_58 = (uv_pipe_t *)0x1aa459;
    iVar1 = uv_is_writable(&channel);
    auStack_50._0_8_ = SEXT48(iVar1);
    if (apuStack_40[0] != (uv_loop_t *)auStack_50._0_8_) goto LAB_001aa713;
    puStack_58 = (uv_pipe_t *)0x1aa47a;
    iVar1 = uv_is_closing(&channel);
    apuStack_40[0] = (uv_loop_t *)(long)iVar1;
    auStack_50._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_40[0] != (uv_loop_t *)0x0) goto LAB_001aa720;
    puStack_58 = (uv_pipe_t *)0x1aa49d;
    uVar2 = uv_default_loop();
    puStack_58 = (uv_pipe_t *)0x1aa4ac;
    iVar1 = uv_tcp_init(uVar2,&tcp_server);
    apuStack_40[0] = (uv_loop_t *)(long)iVar1;
    auStack_50._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_40[0] != (uv_loop_t *)0x0) goto LAB_001aa72d;
    puStack_58 = (uv_pipe_t *)0x1aa4e0;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,apuStack_40);
    auStack_50._0_8_ = SEXT48(iVar1);
    auStack_50._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_50._0_8_ != (uv_loop_t *)0x0) goto LAB_001aa73a;
    puStack_58 = (uv_pipe_t *)0x1aa511;
    iVar1 = uv_tcp_bind(&tcp_server,apuStack_40,0);
    auStack_50._0_8_ = SEXT48(iVar1);
    auStack_50._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_50._0_8_ != (uv_loop_t *)0x0) goto LAB_001aa747;
    puStack_58 = (uv_pipe_t *)0x1aa547;
    iVar1 = uv_listen(&tcp_server,0x80,ipc_on_connection_tcp_conn);
    auStack_50._0_8_ = SEXT48(iVar1);
    auStack_50._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_50._0_8_ != (uv_loop_t *)0x0) goto LAB_001aa754;
    puStack_58 = (uv_pipe_t *)0x1aa56a;
    uVar2 = uv_default_loop();
    puStack_58 = (uv_pipe_t *)0x1aa579;
    iVar1 = uv_tcp_init(uVar2,0x36cc70);
    auStack_50._0_8_ = SEXT48(iVar1);
    auStack_50._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_50._0_8_ != (uv_loop_t *)0x0) goto LAB_001aa761;
    puStack_58 = (uv_pipe_t *)0x1aa5ad;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,apuStack_40);
    auStack_50._0_8_ = SEXT48(iVar1);
    auStack_50._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_50._0_8_ != (uv_loop_t *)0x0) goto LAB_001aa76e;
    puStack_58 = (uv_pipe_t *)0x1aa5ea;
    iVar1 = uv_tcp_connect(&conn,0x36cc70,apuStack_40,connect_child_process_cb);
    auStack_50._0_8_ = SEXT48(iVar1);
    auStack_50._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_50._0_8_ != (uv_loop_t *)0x0) goto LAB_001aa77b;
    puStack_58 = (uv_pipe_t *)0x1aa60d;
    uVar2 = uv_default_loop();
    puStack_58 = (uv_pipe_t *)0x1aa617;
    iVar1 = uv_run(uVar2,0);
    auStack_50._0_8_ = SEXT48(iVar1);
    auStack_50._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_50._0_8_ != (uv_loop_t *)0x0) goto LAB_001aa788;
    auStack_50._0_8_ = (uv_loop_t *)0x1;
    auStack_50._8_8_ = SEXT48(tcp_conn_read_cb_called);
    if ((uv_loop_t *)auStack_50._8_8_ != (uv_loop_t *)0x1) goto LAB_001aa795;
    auStack_50._0_8_ = (uv_loop_t *)0x1;
    auStack_50._8_8_ = SEXT48(tcp_conn_write_cb_called);
    if ((uv_loop_t *)auStack_50._8_8_ != (uv_loop_t *)0x1) goto LAB_001aa7a2;
    auStack_50._0_8_ = (uv_loop_t *)0x4;
    auStack_50._8_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)auStack_50._8_8_ != (uv_loop_t *)0x4) goto LAB_001aa7af;
    puStack_58 = (uv_pipe_t *)0x1aa6a3;
    unaff_RBX = (uv_pipe_t *)uv_default_loop();
    puStack_58 = (uv_pipe_t *)0x1aa6b7;
    uv_walk(unaff_RBX,close_walk_cb,0);
    puStack_58 = (uv_pipe_t *)0x1aa6c1;
    uv_run(unaff_RBX,0);
    auStack_50._0_8_ = (uv_loop_t *)0x0;
    puStack_58 = (uv_pipe_t *)0x1aa6ce;
    uVar2 = uv_default_loop();
    puStack_58 = (uv_pipe_t *)0x1aa6d6;
    iVar1 = uv_loop_close(uVar2);
    auStack_50._8_8_ = SEXT48(iVar1);
    if (auStack_50._0_8_ == auStack_50._8_8_) {
      puStack_58 = (uv_pipe_t *)0x1aa6f1;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_58 = (uv_pipe_t *)0x1aa706;
    ipc_helper_tcp_connection_cold_1();
LAB_001aa706:
    puStack_58 = (uv_pipe_t *)0x1aa713;
    ipc_helper_tcp_connection_cold_2();
LAB_001aa713:
    puStack_58 = (uv_pipe_t *)0x1aa720;
    ipc_helper_tcp_connection_cold_3();
LAB_001aa720:
    puStack_58 = (uv_pipe_t *)0x1aa72d;
    ipc_helper_tcp_connection_cold_4();
LAB_001aa72d:
    puStack_58 = (uv_pipe_t *)0x1aa73a;
    ipc_helper_tcp_connection_cold_5();
LAB_001aa73a:
    puStack_58 = (uv_pipe_t *)0x1aa747;
    ipc_helper_tcp_connection_cold_6();
LAB_001aa747:
    puStack_58 = (uv_pipe_t *)0x1aa754;
    ipc_helper_tcp_connection_cold_7();
LAB_001aa754:
    puStack_58 = (uv_pipe_t *)0x1aa761;
    ipc_helper_tcp_connection_cold_8();
LAB_001aa761:
    puStack_58 = (uv_pipe_t *)0x1aa76e;
    ipc_helper_tcp_connection_cold_9();
LAB_001aa76e:
    puStack_58 = (uv_pipe_t *)0x1aa77b;
    ipc_helper_tcp_connection_cold_10();
LAB_001aa77b:
    puStack_58 = (uv_pipe_t *)0x1aa788;
    ipc_helper_tcp_connection_cold_11();
LAB_001aa788:
    puStack_58 = (uv_pipe_t *)0x1aa795;
    ipc_helper_tcp_connection_cold_12();
LAB_001aa795:
    puStack_58 = (uv_pipe_t *)0x1aa7a2;
    ipc_helper_tcp_connection_cold_13();
LAB_001aa7a2:
    puStack_58 = (uv_pipe_t *)0x1aa7af;
    ipc_helper_tcp_connection_cold_14();
LAB_001aa7af:
    puStack_58 = (uv_pipe_t *)0x1aa7bc;
    ipc_helper_tcp_connection_cold_15();
  }
  iVar1 = (int)auStack_50 + 8;
  puStack_58 = (uv_pipe_t *)ipc_on_connection_tcp_conn;
  ipc_helper_tcp_connection_cold_16();
  plVar7 = alStack_78;
  auStack_68._0_8_ = SEXT48(iVar1);
  alStack_78[0] = 0;
  puStack_58 = unaff_RBX;
  if (auStack_68._0_8_ == 0) {
    if (puVar6 != &tcp_server) goto LAB_001aa917;
    pcStack_80 = (code *)0x1aa807;
    puVar3 = (uv_pipe_t *)malloc(0xd8);
    if (puVar3 == (uv_pipe_t *)0x0) goto LAB_001aa91c;
    pcStack_80 = (code *)0x1aa822;
    iVar1 = uv_tcp_init(tcp_server.loop,puVar3);
    auStack_68._0_8_ = SEXT48(iVar1);
    alStack_78[0] = 0;
    unaff_RBX = puVar3;
    if (auStack_68._0_8_ != 0) goto LAB_001aa921;
    pcStack_80 = (code *)0x1aa84f;
    iVar1 = uv_accept(&tcp_server,puVar3);
    auStack_68._0_8_ = SEXT48(iVar1);
    alStack_78[0] = 0;
    if (auStack_68._0_8_ != 0) goto LAB_001aa92e;
    pcStack_80 = (code *)0x1aa87e;
    auStack_68 = uv_buf_init("hello\n",6);
    pcStack_80 = (code *)0x1aa8ab;
    iVar1 = uv_write2(&conn_notify_req,&channel,auStack_68,1,puVar3,0);
    alStack_78[0] = (long)iVar1;
    alStack_78[1] = 0;
    if (alStack_78[0] != 0) goto LAB_001aa93b;
    pcStack_80 = (code *)0x1aa8db;
    iVar1 = uv_read_start(puVar3,on_read_alloc,on_tcp_child_process_read);
    alStack_78[0] = (long)iVar1;
    alStack_78[1] = 0;
    if (alStack_78[0] == 0) {
      pcStack_80 = (code *)0x1aa904;
      uv_close(puVar3,close_and_free_cb);
      return;
    }
  }
  else {
    pcStack_80 = (code *)0x1aa917;
    ipc_on_connection_tcp_conn_cold_1();
LAB_001aa917:
    pcStack_80 = (code *)0x1aa91c;
    ipc_on_connection_tcp_conn_cold_2();
LAB_001aa91c:
    pcStack_80 = (code *)0x1aa921;
    ipc_on_connection_tcp_conn_cold_7();
LAB_001aa921:
    pcStack_80 = (code *)0x1aa92e;
    ipc_on_connection_tcp_conn_cold_3();
LAB_001aa92e:
    pcStack_80 = (code *)0x1aa93b;
    ipc_on_connection_tcp_conn_cold_4();
LAB_001aa93b:
    pcStack_80 = (code *)0x1aa948;
    ipc_on_connection_tcp_conn_cold_5();
  }
  iVar1 = (int)alStack_78 + 8;
  pcStack_80 = connect_child_process_cb;
  ipc_on_connection_tcp_conn_cold_6();
  pcStack_80 = (code *)(long)iVar1;
  uStack_88 = 0;
  if (pcStack_80 == (code *)0x0) {
    puStack_98 = (uv_pipe_t *)0x1aa98d;
    iVar1 = uv_read_start(*(undefined8 *)((long)plVar7 + 0x50),on_read_alloc,
                          on_tcp_child_process_read);
    pcStack_80 = (code *)(long)iVar1;
    uStack_88 = 0;
    if (pcStack_80 == (code *)0x0) {
      return;
    }
  }
  else {
    puStack_98 = (uv_pipe_t *)0x1aa9bd;
    connect_child_process_cb_cold_1();
  }
  puStack_98 = (uv_pipe_t *)ipc_helper_bind_twice;
  connect_child_process_cb_cold_2();
  puStack_d0 = (uv_pipe_t *)0x1aa9e7;
  puStack_98 = unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_a8);
  auStack_b8._0_8_ = SEXT48(iVar1);
  lStack_c8 = 0;
  if (auStack_b8._0_8_ == 0) {
    puStack_d0 = (uv_pipe_t *)0x1aaa0a;
    uVar2 = uv_default_loop();
    puStack_d0 = (uv_pipe_t *)0x1aaa1e;
    iVar1 = uv_pipe_init(uVar2,&channel,1);
    auStack_b8._0_8_ = SEXT48(iVar1);
    lStack_c8 = 0;
    if (auStack_b8._0_8_ != 0) goto LAB_001aacc7;
    unaff_RBX = &channel;
    puStack_d0 = (uv_pipe_t *)0x1aaa4d;
    uv_pipe_open(&channel,0);
    auStack_b8._0_8_ = 1;
    puStack_d0 = (uv_pipe_t *)0x1aaa5e;
    iVar1 = uv_is_readable(&channel);
    lStack_c8 = (long)iVar1;
    if (auStack_b8._0_8_ != lStack_c8) goto LAB_001aacd4;
    auStack_b8._0_8_ = 1;
    puStack_d0 = (uv_pipe_t *)0x1aaa88;
    iVar1 = uv_is_writable(&channel);
    lStack_c8 = (long)iVar1;
    if (auStack_b8._0_8_ != lStack_c8) goto LAB_001aace1;
    puStack_d0 = (uv_pipe_t *)0x1aaaa9;
    iVar1 = uv_is_closing(&channel);
    auStack_b8._0_8_ = SEXT48(iVar1);
    lStack_c8 = 0;
    if (auStack_b8._0_8_ != 0) goto LAB_001aacee;
    puStack_d0 = (uv_pipe_t *)0x1aaad8;
    auStack_b8 = uv_buf_init("hello\n",6);
    puStack_d0 = (uv_pipe_t *)0x1aaae7;
    uVar2 = uv_default_loop();
    puStack_d0 = (uv_pipe_t *)0x1aaaf6;
    iVar1 = uv_tcp_init(uVar2,&tcp_server);
    lStack_c8 = (long)iVar1;
    lStack_c0 = 0;
    if (lStack_c8 != 0) goto LAB_001aacfb;
    puStack_d0 = (uv_pipe_t *)0x1aab19;
    uVar2 = uv_default_loop();
    puStack_d0 = (uv_pipe_t *)0x1aab28;
    iVar1 = uv_tcp_init(uVar2,&tcp_server2);
    lStack_c8 = (long)iVar1;
    lStack_c0 = 0;
    if (lStack_c8 != 0) goto LAB_001aad08;
    puStack_d0 = (uv_pipe_t *)0x1aab59;
    iVar1 = uv_tcp_bind(&tcp_server,auStack_a8,0);
    lStack_c8 = (long)iVar1;
    lStack_c0 = 0;
    if (lStack_c8 != 0) goto LAB_001aad15;
    puStack_d0 = (uv_pipe_t *)0x1aab8a;
    iVar1 = uv_tcp_bind(&tcp_server2,auStack_a8,0);
    lStack_c8 = (long)iVar1;
    lStack_c0 = 0;
    if (lStack_c8 != 0) goto LAB_001aad22;
    puStack_d0 = (uv_pipe_t *)0x1aabcf;
    iVar1 = uv_write2(&write_req,&channel,auStack_b8,1,&tcp_server,0);
    lStack_c8 = (long)iVar1;
    lStack_c0 = 0;
    if (lStack_c8 != 0) goto LAB_001aad2f;
    puStack_d0 = (uv_pipe_t *)0x1aac14;
    iVar1 = uv_write2(&write_req2,&channel,auStack_b8,1,&tcp_server2,0);
    lStack_c8 = (long)iVar1;
    lStack_c0 = 0;
    if (lStack_c8 != 0) goto LAB_001aad3c;
    puStack_d0 = (uv_pipe_t *)0x1aac37;
    uVar2 = uv_default_loop();
    puStack_d0 = (uv_pipe_t *)0x1aac41;
    iVar1 = uv_run(uVar2,0);
    lStack_c8 = (long)iVar1;
    lStack_c0 = 0;
    if (lStack_c8 != 0) goto LAB_001aad49;
    puStack_d0 = (uv_pipe_t *)0x1aac64;
    unaff_RBX = (uv_pipe_t *)uv_default_loop();
    puStack_d0 = (uv_pipe_t *)0x1aac78;
    uv_walk(unaff_RBX,close_walk_cb,0);
    puStack_d0 = (uv_pipe_t *)0x1aac82;
    uv_run(unaff_RBX,0);
    lStack_c8 = 0;
    puStack_d0 = (uv_pipe_t *)0x1aac8f;
    uVar2 = uv_default_loop();
    puStack_d0 = (uv_pipe_t *)0x1aac97;
    iVar1 = uv_loop_close(uVar2);
    lStack_c0 = (long)iVar1;
    if (lStack_c8 == lStack_c0) {
      puStack_d0 = (uv_pipe_t *)0x1aacb2;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_d0 = (uv_pipe_t *)0x1aacc7;
    ipc_helper_bind_twice_cold_1();
LAB_001aacc7:
    puStack_d0 = (uv_pipe_t *)0x1aacd4;
    ipc_helper_bind_twice_cold_2();
LAB_001aacd4:
    puStack_d0 = (uv_pipe_t *)0x1aace1;
    ipc_helper_bind_twice_cold_3();
LAB_001aace1:
    puStack_d0 = (uv_pipe_t *)0x1aacee;
    ipc_helper_bind_twice_cold_4();
LAB_001aacee:
    puStack_d0 = (uv_pipe_t *)0x1aacfb;
    ipc_helper_bind_twice_cold_5();
LAB_001aacfb:
    puStack_d0 = (uv_pipe_t *)0x1aad08;
    ipc_helper_bind_twice_cold_6();
LAB_001aad08:
    puStack_d0 = (uv_pipe_t *)0x1aad15;
    ipc_helper_bind_twice_cold_7();
LAB_001aad15:
    puStack_d0 = (uv_pipe_t *)0x1aad22;
    ipc_helper_bind_twice_cold_8();
LAB_001aad22:
    puStack_d0 = (uv_pipe_t *)0x1aad2f;
    ipc_helper_bind_twice_cold_9();
LAB_001aad2f:
    puStack_d0 = (uv_pipe_t *)0x1aad3c;
    ipc_helper_bind_twice_cold_10();
LAB_001aad3c:
    puStack_d0 = (uv_pipe_t *)0x1aad49;
    ipc_helper_bind_twice_cold_11();
LAB_001aad49:
    puStack_d0 = (uv_pipe_t *)0x1aad56;
    ipc_helper_bind_twice_cold_12();
  }
  puStack_d0 = (uv_pipe_t *)ipc_helper_send_zero;
  ipc_helper_bind_twice_cold_13();
  iVar5 = (int)&lStack_f0;
  pcStack_f8 = (code *)0x1aad71;
  puStack_d0 = unaff_RBX;
  auStack_e0 = uv_buf_init(0,0);
  pcStack_f8 = (code *)0x1aad80;
  uVar2 = uv_default_loop();
  pcStack_f8 = (code *)0x1aad91;
  iVar1 = uv_pipe_init(uVar2,&channel,0);
  lStack_e8 = (long)iVar1;
  lStack_f0 = 0;
  if (lStack_e8 == 0) {
    pcStack_f8 = (code *)0x1aadc0;
    uv_pipe_open(&channel,0);
    lStack_e8 = 1;
    pcStack_f8 = (code *)0x1aadd1;
    iVar1 = uv_is_readable(&channel);
    lStack_f0 = (long)iVar1;
    if (lStack_e8 != lStack_f0) goto LAB_001aaf30;
    lStack_e8 = 1;
    pcStack_f8 = (code *)0x1aadfb;
    iVar1 = uv_is_writable(&channel);
    lStack_f0 = (long)iVar1;
    if (lStack_e8 != lStack_f0) goto LAB_001aaf3d;
    pcStack_f8 = (code *)0x1aae1c;
    iVar1 = uv_is_closing(&channel);
    lStack_e8 = (long)iVar1;
    lStack_f0 = 0;
    if (lStack_e8 != 0) goto LAB_001aaf4a;
    pcStack_f8 = (code *)0x1aae5e;
    iVar1 = uv_write(&write_req,&channel,auStack_e0,1,send_zero_write_cb);
    lStack_e8 = (long)iVar1;
    lStack_f0 = 0;
    if (lStack_e8 != 0) goto LAB_001aaf57;
    pcStack_f8 = (code *)0x1aae81;
    uVar2 = uv_default_loop();
    pcStack_f8 = (code *)0x1aae8b;
    iVar1 = uv_run(uVar2,0);
    lStack_e8 = (long)iVar1;
    lStack_f0 = 0;
    if (lStack_e8 != 0) goto LAB_001aaf64;
    lStack_e8 = 1;
    lStack_f0 = (long)send_zero_write;
    if (lStack_f0 == 1) {
      pcStack_f8 = (code *)0x1aaed1;
      uVar2 = uv_default_loop();
      pcStack_f8 = (code *)0x1aaee5;
      uv_walk(uVar2,close_walk_cb,0);
      pcStack_f8 = (code *)0x1aaeef;
      uv_run(uVar2,0);
      lStack_e8 = 0;
      pcStack_f8 = (code *)0x1aaefd;
      uVar2 = uv_default_loop();
      pcStack_f8 = (code *)0x1aaf05;
      iVar1 = uv_loop_close(uVar2);
      lStack_f0 = (long)iVar1;
      if (lStack_e8 == lStack_f0) {
        pcStack_f8 = (code *)0x1aaf1b;
        uv_library_shutdown();
        return;
      }
      goto LAB_001aaf7e;
    }
  }
  else {
    pcStack_f8 = (code *)0x1aaf30;
    ipc_helper_send_zero_cold_1();
LAB_001aaf30:
    pcStack_f8 = (code *)0x1aaf3d;
    ipc_helper_send_zero_cold_2();
LAB_001aaf3d:
    pcStack_f8 = (code *)0x1aaf4a;
    ipc_helper_send_zero_cold_3();
LAB_001aaf4a:
    pcStack_f8 = (code *)0x1aaf57;
    ipc_helper_send_zero_cold_4();
LAB_001aaf57:
    pcStack_f8 = (code *)0x1aaf64;
    ipc_helper_send_zero_cold_5();
LAB_001aaf64:
    pcStack_f8 = (code *)0x1aaf71;
    ipc_helper_send_zero_cold_6();
  }
  pcStack_f8 = (code *)0x1aaf7e;
  ipc_helper_send_zero_cold_7();
LAB_001aaf7e:
  pcStack_f8 = send_zero_write_cb;
  ipc_helper_send_zero_cold_8();
  pcStack_f8 = (code *)(long)iVar5;
  uStack_100 = 0;
  if (pcStack_f8 != (code *)0x0) {
    __size = &uStack_100;
    send_zero_write_cb_cold_1();
    pvVar4 = malloc((size_t)__size);
    *extraout_RDX = pvVar4;
    extraout_RDX[1] = __size;
    return;
  }
  send_zero_write = send_zero_write + 1;
  return;
}

Assistant:

static void ipc_on_connection(uv_stream_t* server, int status) {
  int r;
  uv_buf_t buf;

  if (!connection_accepted) {
    /*
     * Accept the connection and close it.  Also let the other
     * side know.
     */
    ASSERT_OK(status);
    ASSERT_PTR_EQ(&tcp_server, server);

    r = uv_tcp_init(server->loop, &conn.conn);
    ASSERT_OK(r);

    r = uv_accept(server, (uv_stream_t*)&conn.conn);
    ASSERT_OK(r);

    uv_close((uv_handle_t*)&conn.conn, close_cb);

    buf = uv_buf_init("accepted_connection\n", 20);
    r = uv_write2(&conn_notify_req, (uv_stream_t*)&channel, &buf, 1,
      NULL, conn_notify_write_cb);
    ASSERT_OK(r);

    connection_accepted = 1;
  }
}